

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O3

void compareTwoVectorsWithAssert
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *v1,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *v2)

{
  void *__s1;
  int iVar1;
  size_t __n;
  
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  std::ostream::flush();
  __s1 = *(void **)v1;
  __n = (long)*(void **)(v1 + 8) - (long)__s1;
  if (__n == *(long *)(v2 + 8) - (long)*(void **)v2) {
    if (*(void **)(v1 + 8) != __s1) {
      iVar1 = bcmp(__s1,*(void **)v2,__n);
      if (iVar1 != 0) goto LAB_00102505;
    }
    return;
  }
LAB_00102505:
  __assert_fail("v1 == v2",
                "/workspace/llm4binary/github/license_c_cmakelists/dtysky[P]Algorithm/utils.h",0x39,
                "void compareTwoVectorsWithAssert(std::vector<uint32_t> &, std::vector<uint32_t> &)"
               );
}

Assistant:

void compareTwoVectorsWithAssert(std::vector<uint32_t >& v1, std::vector<uint32_t >& v2) {
    std::cout << std::endl;
    assert(v1 == v2);
}